

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgesture.cpp
# Opt level: O0

void __thiscall QTapAndHoldGesture::QTapAndHoldGesture(QTapAndHoldGesture *this,QObject *parent)

{
  QTapAndHoldGesturePrivate *pQVar1;
  QGesture *in_RSI;
  QGesturePrivate *in_RDI;
  
  pQVar1 = (QTapAndHoldGesturePrivate *)operator_new(0xc0);
  QTapAndHoldGesturePrivate::QTapAndHoldGesturePrivate(pQVar1);
  QGesture::QGesture(in_RSI,in_RDI,(QObject *)pQVar1);
  *(undefined ***)in_RDI = &PTR_metaObject_00d06e50;
  pQVar1 = d_func((QTapAndHoldGesture *)0x2fc1cf);
  (pQVar1->super_QGesturePrivate).gestureType = TapAndHoldGesture;
  return;
}

Assistant:

QTapAndHoldGesture::QTapAndHoldGesture(QObject *parent)
    : QGesture(*new QTapAndHoldGesturePrivate, parent)
{
    d_func()->gestureType = Qt::TapAndHoldGesture;
}